

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::apply_predicate
          (xpath_ast_node *this,xpath_node_set_raw *ns,size_t first,xpath_stack *stack,bool once)

{
  xpath_ast_node *this_00;
  xml_attribute_struct *pxVar1;
  bool bVar2;
  xpath_node *pxVar3;
  ulong uVar4;
  size_t sVar5;
  xpath_node *it;
  xpath_node *pxVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  xpath_context c;
  xpath_node cn;
  xpath_context local_68;
  xpath_node local_40;
  
  pxVar3 = ns->_begin;
  uVar4 = (long)ns->_end - (long)pxVar3 >> 4;
  if (uVar4 != first) {
    if ((this->_type & 0xfeU) != 0x10) {
      __assert_fail("_type == ast_filter || _type == ast_predicate",
                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                    ,0x26ff,
                    "void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate(xpath_node_set_raw &, size_t, const xpath_stack &, bool)"
                   );
    }
    this_00 = this->_right;
    if ((this->_test & 0xfeU) == 2) {
      sVar5 = uVar4 - first;
      if (uVar4 < first) {
        __assert_fail("ns.size() >= first",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x26e0,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number_const(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &)"
                     );
      }
      if (this_00->_rettype != '\x02') {
        __assert_fail("expr->rettype() == xpath_type_number",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x26e1,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number_const(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &)"
                     );
      }
      pxVar3 = pxVar3 + first;
      xpath_node::xpath_node(&local_40);
      local_68.n._node._root = local_40._node._root;
      local_68.n._attribute._attr = local_40._attribute._attr;
      local_68.position = 1;
      local_68.size = sVar5;
      dVar7 = eval_number(this_00,&local_68,stack);
      if ((1.0 <= dVar7) &&
         (auVar8._8_4_ = (int)(sVar5 >> 0x20), auVar8._0_8_ = sVar5, auVar8._12_4_ = 0x45300000,
         dVar7 <= (auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0))) {
        uVar4 = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
        auVar9._8_4_ = (int)(uVar4 >> 0x20);
        auVar9._0_8_ = uVar4;
        auVar9._12_4_ = 0x45300000;
        dVar11 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
        if ((dVar7 == dVar11) && (!NAN(dVar7) && !NAN(dVar11))) {
          pxVar1 = pxVar3[uVar4 - 1]._attribute._attr;
          (pxVar3->_node)._root = pxVar3[uVar4 - 1]._node._root;
          (pxVar3->_attribute)._attr = pxVar1;
          pxVar3 = pxVar3 + 1;
        }
      }
      if ((pxVar3 < ns->_begin) || (ns->_end < pxVar3)) goto LAB_0038dff6;
      ns->_end = pxVar3;
    }
    else if (this_00->_rettype == '\x02') {
      if (uVar4 < first) {
        __assert_fail("ns.size() >= first",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x26c6,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_number(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                     );
      }
      pxVar3 = pxVar3 + first;
      if (pxVar3 != ns->_end) {
        sVar5 = 1;
        pxVar6 = pxVar3;
        do {
          local_68.n._node._root = (pxVar6->_node)._root;
          local_68.n._attribute._attr = (pxVar6->_attribute)._attr;
          local_68.position = sVar5;
          local_68.size = uVar4 - first;
          dVar7 = eval_number(this_00,&local_68,stack);
          auVar10._8_4_ = (int)(sVar5 >> 0x20);
          auVar10._0_8_ = sVar5;
          auVar10._12_4_ = 0x45300000;
          dVar11 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0);
          if ((dVar7 != dVar11) || (NAN(dVar7) || NAN(dVar11))) {
            bVar2 = true;
          }
          else {
            pxVar1 = (pxVar6->_attribute)._attr;
            (pxVar3->_node)._root = (pxVar6->_node)._root;
            (pxVar3->_attribute)._attr = pxVar1;
            pxVar3 = pxVar3 + 1;
            bVar2 = !once;
          }
          if (!bVar2) break;
          pxVar6 = pxVar6 + 1;
          sVar5 = sVar5 + 1;
        } while (pxVar6 != ns->_end);
      }
      if ((pxVar3 < ns->_begin) || (ns->_end < pxVar3)) {
LAB_0038dff6:
        __assert_fail("_begin <= pos && pos <= _end",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x23b6,
                      "void pugi::impl::(anonymous namespace)::xpath_node_set_raw::truncate(xpath_node *)"
                     );
      }
      ns->_end = pxVar3;
    }
    else {
      if (uVar4 < first) {
        __assert_fail("ns.size() >= first",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                      ,0x26ac,
                      "static void pugi::impl::(anonymous namespace)::xpath_ast_node::apply_predicate_boolean(xpath_node_set_raw &, size_t, xpath_ast_node *, const xpath_stack &, bool)"
                     );
      }
      pxVar3 = pxVar3 + first;
      pxVar6 = pxVar3;
      if (pxVar3 != ns->_end) {
        sVar5 = 1;
        do {
          local_68.n._node._root = (pxVar3->_node)._root;
          local_68.n._attribute._attr = (pxVar3->_attribute)._attr;
          local_68.position = sVar5;
          local_68.size = uVar4 - first;
          bVar2 = eval_boolean(this_00,&local_68,stack);
          if (bVar2) {
            pxVar1 = (pxVar3->_attribute)._attr;
            (pxVar6->_node)._root = (pxVar3->_node)._root;
            (pxVar6->_attribute)._attr = pxVar1;
            pxVar6 = pxVar6 + 1;
          }
          if (bVar2 && once) break;
          pxVar3 = pxVar3 + 1;
          sVar5 = sVar5 + 1;
        } while (pxVar3 != ns->_end);
      }
      if ((pxVar6 < ns->_begin) || (ns->_end < pxVar6)) goto LAB_0038dff6;
      ns->_end = pxVar6;
    }
  }
  return;
}

Assistant:

void apply_predicate(xpath_node_set_raw& ns, size_t first, const xpath_stack& stack, bool once)
		{
			if (ns.size() == first) return;

			assert(_type == ast_filter || _type == ast_predicate);

			if (_test == predicate_constant || _test == predicate_constant_one)
				apply_predicate_number_const(ns, first, _right, stack);
			else if (_right->rettype() == xpath_type_number)
				apply_predicate_number(ns, first, _right, stack, once);
			else
				apply_predicate_boolean(ns, first, _right, stack, once);
		}